

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

void __thiscall
absl::str_format_internal::anon_unknown_53::IntDigits::PrintAsHexLower<absl::uint128>
          (IntDigits *this,uint128 v)

{
  undefined2 uVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  
  uVar7 = v.lo_;
  pcVar3 = &this->field_0x3d;
  uVar4 = v.hi_;
  do {
    do {
      pcVar6 = pcVar3;
      uVar1 = *(undefined2 *)(numbers_internal::kHexTable + (uVar7 & 0xff) * 2);
      uVar7 = uVar7 >> 8 | uVar4 << 0x38;
      *(undefined2 *)(pcVar6 + -3) = uVar1;
      uVar5 = uVar4 >> 8;
      pcVar3 = pcVar6 + -2;
      bVar2 = 0xff < uVar4;
      uVar4 = uVar5;
    } while (bVar2);
  } while (uVar7 != 0);
  pcVar6 = pcVar6 + -3;
  if ((char)uVar1 == '0') {
    pcVar6 = pcVar3;
  }
  this->start_ = pcVar6;
  this->size_ = (long)this + (0x3c - (long)pcVar6);
  return;
}

Assistant:

void PrintAsHexLower(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    do {
      p -= 2;
      constexpr const char* table = numbers_internal::kHexTable;
      std::memcpy(p, table + 2 * (static_cast<size_t>(v) & 0xFF), 2);
      if (sizeof(T) == 1) break;
      v >>= 8;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many digits.
      ++p;
    }
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }